

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O3

void __thiscall
re2::NFA::AddToThreadq(NFA *this,Threadq *q,int id0,int c,int flag,char *p,Thread *t0)

{
  AddState *pAVar1;
  Inst *pIVar2;
  char **ppcVar3;
  iterator iVar4;
  Thread *pTVar5;
  char **ppcVar6;
  ostream *poVar7;
  int iVar8;
  uint uVar9;
  uint uVar11;
  Thread *pTVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  ulong local_1f0;
  LogMessage local_1b0;
  uint uVar10;
  
  if (id0 == 0) {
    return;
  }
  pAVar1 = this->astack_;
  pAVar1->id = id0;
  pAVar1->t = (Thread *)0x0;
  local_1f0 = 1;
LAB_00129da0:
  if (this->nastack_ < (int)local_1f0) {
    __assert_fail("(nstk) <= (nastack_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc",0xd8
                  ,"void re2::NFA::AddToThreadq(Threadq *, int, int, int, const char *, Thread *)");
  }
  local_1f0 = (ulong)((int)local_1f0 - 1);
  uVar9 = pAVar1[local_1f0].id;
  pTVar5 = pAVar1[local_1f0].t;
LAB_00129dc6:
  uVar15 = (ulong)uVar9;
  pTVar12 = t0;
LAB_00129dcb:
  t0 = pTVar12;
  if ((pTVar5 != (Thread *)0x0) && (t0 = pTVar5, pTVar12 != (Thread *)0x0)) {
    iVar14 = (pTVar12->field_0).ref;
    iVar8 = iVar14 + -1;
    (pTVar12->field_0).ref = iVar8;
    if (iVar14 < 2) {
      if (iVar8 != 0) {
        __assert_fail("(t->ref) == (0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc",
                      0xb7,"void re2::NFA::Decref(Thread *)");
      }
      pTVar12->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->free_threads_;
      this->free_threads_ = pTVar12;
    }
  }
  if (uVar15 == 0) goto switchD_00129e73_caseD_7;
  if ((int)uVar9 < 0) {
    __assert_fail("(i) >= (0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                  ,0x134,
                  "bool re2::SparseArray<re2::NFA::Thread *>::has_index(int) const [Value = re2::NFA::Thread *]"
                 );
  }
  iVar14 = (int)uVar15;
  if (q->max_size_ <= iVar14) {
    __assert_fail("(i) < (max_size_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                  ,0x135,
                  "bool re2::SparseArray<re2::NFA::Thread *>::has_index(int) const [Value = re2::NFA::Thread *]"
                 );
  }
  if (((uint)q->sparse_to_dense_[uVar15] < (uint)q->size_) &&
     (uVar15 == (uint)(q->dense_).
                      super__Vector_base<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>
                      ._M_impl.super__Vector_impl_data._M_start[q->sparse_to_dense_[uVar15]].index_)
     ) goto switchD_00129e73_caseD_7;
  SparseArray<re2::NFA::Thread_*>::set_new(q,iVar14,(Thread *)0x0);
  iVar4 = SparseArray<re2::NFA::Thread_*>::find(q,iVar14);
  pIVar2 = this->prog_->inst_;
  uVar10 = pIVar2[uVar15].out_opcode_;
  switch(uVar10 & 7) {
  case 0:
    LogMessage::LogMessage
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc",0xf7,3)
    ;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0.str_,"unhandled ",10);
    poVar7 = (ostream *)
             std::ostream::operator<<((ostream *)&local_1b0.str_,pIVar2[uVar15].out_opcode_ & 7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," in AddToThreadq",0x10);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
    break;
  case 1:
    if (t0 == (Thread *)0x0) goto LAB_0012a154;
    (t0->field_0).ref = (t0->field_0).ref + 1;
    (iVar4._M_current)->second = t0;
    if ((pIVar2[uVar15].out_opcode_ & 8) != 0) {
      __assert_fail("!ip->last()",
                    "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc",
                    0x102,
                    "void re2::NFA::AddToThreadq(Threadq *, int, int, int, const char *, Thread *)")
      ;
    }
    goto LAB_00129ed8;
  case 2:
    uVar11 = c;
    if (pIVar2[uVar15].field_1.field_3.foldcase_ != '\0') {
      uVar11 = c | 0x20;
    }
    if (0x19 < c - 0x41U) {
      uVar11 = c;
    }
    if (((int)(uint)pIVar2[uVar15].field_1.field_3.lo_ <= (int)uVar11) &&
       ((int)uVar11 <= (int)(uint)pIVar2[uVar15].field_1.field_3.hi_))
    goto switchD_00129e73_caseD_5;
    goto LAB_00129ecf;
  case 3:
    goto switchD_00129e73_caseD_3;
  case 4:
    uVar13 = local_1f0;
    if ((uVar10 & 8) == 0) {
      pAVar1[(int)local_1f0].id = iVar14 + 1;
      pAVar1[(int)local_1f0].t = (Thread *)0x0;
      uVar10 = pIVar2[uVar15].out_opcode_;
      uVar13 = (ulong)((int)local_1f0 + 1);
    }
    local_1f0 = uVar13;
    if ((uVar10 & 7) != 4) {
      __assert_fail("(opcode()) == (kInstEmptyWidth)",
                    "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/prog.h",
                    0x73,"EmptyOp re2::Prog::Inst::empty()");
    }
    if ((pIVar2[uVar15].field_1.out1_ & ~flag) == 0) goto LAB_0012a08d;
    break;
  case 5:
switchD_00129e73_caseD_5:
    if (t0 == (Thread *)0x0) {
LAB_0012a154:
      __assert_fail("t != __null",
                    "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc",
                    0xac,"NFA::Thread *re2::NFA::Incref(Thread *)");
    }
    (t0->field_0).ref = (t0->field_0).ref + 1;
    (iVar4._M_current)->second = t0;
    uVar10 = pIVar2[uVar15].out_opcode_;
LAB_00129ecf:
    if ((uVar10 & 8) != 0) break;
LAB_00129ed8:
    uVar15 = uVar15 + 1;
    pTVar5 = (Thread *)0x0;
    pTVar12 = t0;
    goto LAB_00129dcb;
  case 6:
    if ((uVar10 & 8) != 0) goto LAB_0012a08d;
    pAVar1[(int)local_1f0].id = iVar14 + 1;
    pAVar1[(int)local_1f0].t = (Thread *)0x0;
    pTVar5 = t0;
    goto LAB_0012a082;
  }
switchD_00129e73_caseD_7:
  if ((int)local_1f0 < 1) {
    return;
  }
  goto LAB_00129da0;
switchD_00129e73_caseD_3:
  uVar13 = local_1f0;
  if ((uVar10 & 8) == 0) {
    pAVar1[(int)local_1f0].id = iVar14 + 1;
    pAVar1[(int)local_1f0].t = (Thread *)0x0;
    uVar10 = pIVar2[uVar15].out_opcode_;
    uVar13 = (ulong)((int)local_1f0 + 1);
  }
  local_1f0 = uVar13;
  if ((uVar10 & 7) != 3) {
    __assert_fail("(opcode()) == (kInstCapture)",
                  "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/prog.h",0x6e
                  ,"int re2::Prog::Inst::cap()");
  }
  iVar14 = pIVar2[uVar15].field_1.cap_;
  if (iVar14 < this->ncapture_) {
    pAVar1[(int)local_1f0].id = 0;
    pAVar1[(int)local_1f0].t = t0;
    pTVar5 = this->free_threads_;
    if (pTVar5 == (Thread *)0x0) {
      pTVar5 = (Thread *)operator_new(0x10);
      (pTVar5->field_0).ref = 1;
      uVar9 = this->ncapture_;
      uVar13 = (long)(int)uVar9 * 8;
      if ((long)(int)uVar9 < 0) {
        uVar13 = 0xffffffffffffffff;
      }
      ppcVar6 = (char **)operator_new__(uVar13);
      pTVar5->capture = ppcVar6;
    }
    else {
      this->free_threads_ = (Thread *)pTVar5->field_0;
      (pTVar5->field_0).ref = 1;
      ppcVar6 = pTVar5->capture;
      uVar9 = this->ncapture_;
    }
    if (0 < (int)uVar9) {
      ppcVar3 = t0->capture;
      uVar13 = 0;
      do {
        ppcVar6[uVar13] = ppcVar3[uVar13];
        ppcVar6[uVar13 + 1] = ppcVar3[uVar13 + 1];
        uVar13 = uVar13 + 2;
      } while (uVar13 < uVar9);
      ppcVar6 = pTVar5->capture;
    }
    ppcVar6[iVar14] = p;
LAB_0012a082:
    local_1f0 = (ulong)((int)local_1f0 + 1);
    uVar10 = pIVar2[uVar15].out_opcode_;
    t0 = pTVar5;
  }
LAB_0012a08d:
  uVar9 = uVar10 >> 4;
  pTVar5 = (Thread *)0x0;
  goto LAB_00129dc6;
}

Assistant:

void NFA::AddToThreadq(Threadq* q, int id0, int c, int flag,
                       const char* p, Thread* t0) {
  if (id0 == 0)
    return;

  // Use astack_ to hold our stack of instructions yet to process.
  // It was preallocated as follows:
  //   two entries per Capture;
  //   one entry per EmptyWidth; and
  //   one entry per Nop.
  // This reflects the maximum number of stack pushes that each can
  // perform. (Each instruction can be processed at most once.)
  AddState* stk = astack_;
  int nstk = 0;

  stk[nstk++] = AddState(id0);
  while (nstk > 0) {
    DCHECK_LE(nstk, nastack_);
    AddState a = stk[--nstk];

  Loop:
    if (a.t != NULL) {
      // t0 was a thread that we allocated and copied in order to
      // record the capture, so we must now decref it.
      Decref(t0);
      t0 = a.t;
    }

    int id = a.id;
    if (id == 0)
      continue;
    if (q->has_index(id)) {
      if (Debug)
        fprintf(stderr, "  [%d%s]\n", id, FormatCapture(t0->capture).c_str());
      continue;
    }

    // Create entry in q no matter what.  We might fill it in below,
    // or we might not.  Even if not, it is necessary to have it,
    // so that we don't revisit id0 during the recursion.
    q->set_new(id, NULL);

    Thread** tp = &q->find(id)->second;
    int j;
    Thread* t;
    Prog::Inst* ip = prog_->inst(id);
    switch (ip->opcode()) {
    default:
      LOG(DFATAL) << "unhandled " << ip->opcode() << " in AddToThreadq";
      break;

    case kInstFail:
      break;

    case kInstAltMatch:
      // Save state; will pick up at next byte.
      t = Incref(t0);
      *tp = t;

      DCHECK(!ip->last());
      a = AddState(id+1);
      goto Loop;

    case kInstNop:
      if (!ip->last())
        stk[nstk++] = AddState(id+1);

      // Continue on.
      a = AddState(ip->out());
      goto Loop;

    case kInstCapture:
      if (!ip->last())
        stk[nstk++] = AddState(id+1);

      if ((j=ip->cap()) < ncapture_) {
        // Push a dummy whose only job is to restore t0
        // once we finish exploring this possibility.
        stk[nstk++] = AddState(0, t0);

        // Record capture.
        t = AllocThread();
        CopyCapture(t->capture, t0->capture);
        t->capture[j] = p;
        t0 = t;
      }
      a = AddState(ip->out());
      goto Loop;

    case kInstByteRange:
      if (!ip->Matches(c))
        goto Next;
      // Fallthrough intended.

    case kInstMatch:
      // Save state; will pick up at next byte.
      t = Incref(t0);
      *tp = t;
      if (Debug)
        fprintf(stderr, " + %d%s\n", id, FormatCapture(t0->capture).c_str());

    Next:
      if (ip->last())
        break;
      a = AddState(id+1);
      goto Loop;

    case kInstEmptyWidth:
      if (!ip->last())
        stk[nstk++] = AddState(id+1);

      // Continue on if we have all the right flag bits.
      if (ip->empty() & ~flag)
        break;
      a = AddState(ip->out());
      goto Loop;
    }
  }
}